

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O0

void __thiscall OpenMD::SelectionEvaluator::SelectionEvaluator(SelectionEvaluator *this,SimInfo *si)

{
  int iVar1;
  value_type_conflict1 *__x;
  undefined8 in_RSI;
  long in_RDI;
  SimInfo *info;
  NameFinder *this_00;
  SimInfo *info_00;
  IndexFinder *this_01;
  SimInfo *in_stack_00000168;
  DistanceFinder *in_stack_00000170;
  SimInfo *in_stack_00000198;
  HullFinder *in_stack_000001a0;
  SimInfo *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  
  SelectionCompiler::SelectionCompiler
            ((SelectionCompiler *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  std::__cxx11::string::string((string *)(in_RDI + 0x138));
  info = (SimInfo *)(in_RDI + 0x158);
  std::__cxx11::string::string((string *)info);
  this_00 = (NameFinder *)(in_RDI + 0x178);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x2de12b);
  info_00 = (SimInfo *)(in_RDI + 400);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x2de147);
  this_01 = (IndexFinder *)(in_RDI + 0x1a8);
  std::
  vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
  ::vector((vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
            *)0x2de163);
  *(undefined1 *)(in_RDI + 0x1c4) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 0x1c8));
  std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::vector
            ((vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *)0x2de1a2);
  *(undefined8 *)(in_RDI + 0x208) = in_RSI;
  NameFinder::NameFinder(this_00,info);
  DistanceFinder::DistanceFinder(in_stack_00000170,in_stack_00000168);
  HullFinder::HullFinder(in_stack_000001a0,in_stack_00000198);
  AlphaHullFinder::AlphaHullFinder
            ((AlphaHullFinder *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             in_stack_fffffffffffffee8);
  IndexFinder::IndexFinder(this_01,info_00);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x2de294);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
         *)0x2de2ad);
  *(undefined1 *)(in_RDI + 0x530) = 0;
  *(undefined1 *)(in_RDI + 0x531) = 0;
  *(undefined1 *)(in_RDI + 0x532) = 0;
  *(undefined1 *)(in_RDI + 0x540) = 0;
  SimInfo::getNGlobalAtoms(*(SimInfo **)(in_RDI + 0x208));
  SimInfo::getNGlobalRigidBodies(*(SimInfo **)(in_RDI + 0x208));
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             (value_type_conflict1 *)in_stack_fffffffffffffee8);
  SimInfo::getNGlobalBonds(*(SimInfo **)(in_RDI + 0x208));
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             (value_type_conflict1 *)in_stack_fffffffffffffee8);
  SimInfo::getNGlobalBends(*(SimInfo **)(in_RDI + 0x208));
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             (value_type_conflict1 *)in_stack_fffffffffffffee8);
  SimInfo::getNGlobalTorsions(*(SimInfo **)(in_RDI + 0x208));
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             (value_type_conflict1 *)in_stack_fffffffffffffee8);
  SimInfo::getNGlobalInversions(*(SimInfo **)(in_RDI + 0x208));
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             (value_type_conflict1 *)in_stack_fffffffffffffee8);
  __x = (value_type_conflict1 *)(in_RDI + 0x4e8);
  iVar1 = SimInfo::getNGlobalMolecules(*(SimInfo **)(in_RDI + 0x208));
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)CONCAT44(iVar1,in_stack_fffffffffffffef0),__x);
  return;
}

Assistant:

SelectionEvaluator::SelectionEvaluator(SimInfo* si) :
      info(si), nameFinder(info), distanceFinder(info), hullFinder(info),
      alphaHullFinder(info), indexFinder(info), isLoaded_(false),
      hasSurfaceArea_(false), hasVolume_(false) {
    nObjects.push_back(info->getNGlobalAtoms() + info->getNGlobalRigidBodies());
    nObjects.push_back(info->getNGlobalBonds());
    nObjects.push_back(info->getNGlobalBends());
    nObjects.push_back(info->getNGlobalTorsions());
    nObjects.push_back(info->getNGlobalInversions());
    nObjects.push_back(info->getNGlobalMolecules());
  }